

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O2

TRef lj_record_constify(jit_State *J,cTValue *o)

{
  lua_Number n;
  uint uVar1;
  TRef TVar2;
  uint uVar3;
  ulong uVar4;
  IRType t;
  
  n = (lua_Number)o->it64;
  uVar4 = (long)n >> 0x2f;
  uVar1 = (uint)((long)n >> 0x2f);
  if (uVar1 + 0xd < 9) {
    t = IRT_NUM;
    if (0xfffffffffffffff1 < uVar4) {
      t = ~uVar1;
    }
    TVar2 = lj_ir_kgc(J,(GCobj *)((ulong)n & 0x7fffffffffff),t);
    return TVar2;
  }
  if (uVar4 < 0xfffffffffffffff2) {
    TVar2 = lj_ir_knumint(J,n);
    return TVar2;
  }
  uVar3 = 0;
  if (uVar4 + 3 < 2) {
    uVar3 = ~uVar1 * 0x1000001 ^ 0x7fff;
  }
  return uVar3;
}

Assistant:

TRef lj_record_constify(jit_State *J, cTValue *o)
{
  if (tvisgcv(o))
    return lj_ir_kgc(J, gcV(o), itype2irt(o));
  else if (tvisint(o))
    return lj_ir_kint(J, intV(o));
  else if (tvisnum(o))
    return lj_ir_knumint(J, numV(o));
  else if (tvisbool(o))
    return TREF_PRI(itype2irt(o));
  else
    return 0;  /* Can't represent lightuserdata (pointless). */
}